

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O2

bool __thiscall PDA::Transducer::StoreFst::rollback(StoreFst *this)

{
  int iVar1;
  pointer pRVar2;
  bool bVar3;
  int iVar4;
  Settings *this_00;
  wostream *pwVar5;
  _Elt_pointer pSVar6;
  allocator<wchar_t> local_39;
  wstring local_38 [32];
  
  this_00 = Utils::Settings::Instance();
  bVar3 = Utils::Settings::isSyntaxTraceEnabled(this_00);
  if (bVar3) {
    *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
    pwVar5 = std::operator<<((wostream *)&std::wcout,L"Rollback");
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar5);
  }
  if ((this->m_mostState).m_sourcePosition <= (this->m_currentState).m_sourcePosition) {
    State::operator=(&this->m_mostState,&this->m_currentState);
  }
  do {
    pSVar6 = (this->m_states).c.
             super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pSVar6 == (this->m_states).c.
                  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_38,L"Stack empty",&local_39);
      raise(this,(int)local_38);
    }
    if (pSVar6 == (this->m_states).c.
                  super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pSVar6 = (this->m_states).c.
               super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
    }
    State::operator=(&this->m_currentState,pSVar6 + -1);
    std::deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
    ::pop_back(&(this->m_states).c);
    iVar4 = (this->m_currentState).m_chainIndex + 1;
    (this->m_currentState).m_chainIndex = iVar4;
    iVar1 = (this->m_currentState).m_ruleIndex;
    pRVar2 = (this->m_grammar).m_rules.
             super__Vector_base<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
             ._M_impl.super__Vector_impl_data._M_start;
  } while ((int)((ulong)((long)*(pointer *)
                                ((long)&pRVar2[iVar1].m_chains.
                                        super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                                + 8) -
                        *(long *)&pRVar2[iVar1].m_chains.
                                  super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                        ) >> 5) <= iVar4);
  return true;
}

Assistant:

bool rollback()
    {
        if (Utils::Settings::Instance().isSyntaxTraceEnabled())
            std::wcout << std::setw(10) << L"Rollback" << std::endl;
        if (m_currentState.m_sourcePosition >= m_mostState.m_sourcePosition)
            m_mostState = m_currentState;
        do
        {
            if (m_states.empty())
                raise(L"Stack empty");
            m_currentState = m_states.top();
            m_states.pop();
            ++m_currentState.m_chainIndex;
        } while (m_currentState.m_chainIndex >= static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size()));
        return true;
    }